

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxColorLiteral::Resolve(FxColorLiteral *this,FCompileContext *ctx)

{
  FArgumentList *this_00;
  uint uVar1;
  long *plVar2;
  FxExpression *this_01;
  bool bVar3;
  char cVar4;
  undefined4 uVar5;
  int iVar6;
  undefined8 uVar7;
  FxExpression **ppFVar8;
  FxColorLiteral *this_02;
  byte bVar9;
  FCompileContext *o;
  int iVar10;
  long lVar11;
  ExpVal local_40;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    this_00 = &this->ArgList;
    uVar1 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    if (uVar1 == 3) {
      local_40.Type = (PType *)0x0;
      o = (FCompileContext *)0x0;
      TArray<FxExpression_*,_FxExpression_*>::Insert
                (&this_00->super_TArray<FxExpression_*,_FxExpression_*>,0,(FxExpression **)&local_40
                );
    }
    else {
      o = ctx;
      if (uVar1 != 4) {
        __assert_fail("ArgList.Size() == 3 || ArgList.Size() == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x20ce,"virtual FxExpression *FxColorLiteral::Resolve(FCompileContext &)");
      }
    }
    bVar9 = 0x18;
    iVar10 = 0;
    for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 8) {
      plVar2 = *(long **)((long)(this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array +
                         lVar11);
      if (plVar2 == (long *)0x0) {
LAB_00517f33:
        iVar10 = iVar10 + 1;
      }
      else {
        o = ctx;
        uVar7 = (**(code **)(*plVar2 + 0x10))();
        *(undefined8 *)
         ((long)(this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array + lVar11) = uVar7;
        this_01 = *(FxExpression **)
                   ((long)(this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array + lVar11);
        if (this_01 == (FxExpression *)0x0) {
LAB_00517f93:
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          return (FxExpression *)0x0;
        }
        bVar3 = FxExpression::IsInteger(this_01);
        if (!bVar3) {
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "Integer expected for color component");
          goto LAB_00517f93;
        }
        cVar4 = (**(code **)(**(long **)((long)(this_00->
                                               super_TArray<FxExpression_*,_FxExpression_*>).Array +
                                        lVar11) + 0x18))();
        if (cVar4 != '\0') {
          o = (FCompileContext *)
              (*(long *)((long)(this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array +
                        lVar11) + 0x28);
          ExpVal::ExpVal(&local_40,(ExpVal *)o);
          if ((local_40.Type)->RegType == '\x01') {
            uVar5 = (int)(double)CONCAT44(local_40.field_1._4_4_,local_40.field_1.Int);
LAB_00517ef3:
            if (0xfe < (int)uVar5) {
              uVar5 = 0xff;
            }
            iVar6 = uVar5;
            if ((int)uVar5 < 1) {
              iVar6 = 0;
            }
          }
          else {
            uVar5 = local_40.field_1.Int;
            iVar6 = 0;
            if ((local_40.Type)->RegType == '\0') goto LAB_00517ef3;
          }
          this->constval = this->constval + (iVar6 << (bVar9 & 0x1f));
          ExpVal::~ExpVal(&local_40);
          ppFVar8 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
          if (*(long **)((long)ppFVar8 + lVar11) != (long *)0x0) {
            (**(code **)(**(long **)((long)ppFVar8 + lVar11) + 8))();
            ppFVar8 = (this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array;
          }
          *(undefined8 *)((long)ppFVar8 + lVar11) = 0;
          goto LAB_00517f33;
        }
      }
      bVar9 = bVar9 - 8;
    }
    if (iVar10 == 4) {
      this_02 = (FxColorLiteral *)FxExpression::operator_new((FxExpression *)0x38,(size_t)o);
      FxConstant::FxConstant
                ((FxConstant *)this_02,this->constval,&(this->super_FxExpression).ScriptPosition);
      (this_02->super_FxExpression).ValueType = (PType *)TypeColor;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = this_02;
    }
    else {
      (this->super_FxExpression).ValueType = (PType *)TypeColor;
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxColorLiteral::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	unsigned constelements = 0;
	assert(ArgList.Size() == 3 || ArgList.Size() == 4);
	if (ArgList.Size() == 3) ArgList.Insert(0, nullptr);
	for (int i = 0; i < 4; i++)
	{
		if (ArgList[i] != nullptr)
		{
			SAFE_RESOLVE(ArgList[i], ctx);
			if (!ArgList[i]->IsInteger())
			{
				ScriptPosition.Message(MSG_ERROR, "Integer expected for color component");
				delete this;
				return nullptr;
			}
			if (ArgList[i]->isConstant())
			{
				constval += clamp(static_cast<FxConstant *>(ArgList[i])->GetValue().GetInt(), 0, 255) << (24 - i * 8);
				delete ArgList[i];
				ArgList[i] = nullptr;
				constelements++;
			}
		}
		else constelements++;
	}
	if (constelements == 4)
	{
		auto x = new FxConstant(constval, ScriptPosition);
		x->ValueType = TypeColor;
		delete this;
		return x;
	}
	ValueType = TypeColor;
	return this;
}